

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O3

void QGraphicsEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  void *pvVar1;
  long in_FS_OFFSET;
  undefined1 local_19;
  void *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      if (*(long *)(*(long *)(_o + 8) + 0x78) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          (**(code **)(**(long **)(*(long *)(*(long *)(_o + 8) + 0x78) + 8) + 0x58))();
          return;
        }
        goto LAB_00393e49;
      }
    }
    else {
      if (_id == 1) {
        pvVar1 = _a[1];
        goto LAB_00393dfd;
      }
      if (_id == 0) {
        local_19 = *_a[1];
        local_10 = &local_19;
        local_18 = (void *)0x0;
        QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
      }
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0xa0) & 1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      pvVar1 = *_a;
LAB_00393dfd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setEnabled((QGraphicsEffect *)_o,*pvVar1);
        return;
      }
      goto LAB_00393e49;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == enabledChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00393e49:
  __stack_chk_fail();
}

Assistant:

void QGraphicsEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->enabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->update(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsEffect::*)(bool )>(_a, &QGraphicsEffect::enabledChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}